

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

void setupGenerator(Generator *g,int mc,uint32_t flags)

{
  int *piVar1;
  Layer *pLVar2;
  uint in_EDX;
  int in_ESI;
  int *in_RDI;
  LayerStack *unaff_retaddr;
  Layer *in_stack_00000008;
  int in_stack_0000002c;
  BiomeNoise *in_stack_00000030;
  mapfunc_t *in_stack_ffffffffffffffe8;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 1000;
  in_RDI[2] = in_EDX;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  if ((in_ESI < 2) || (0x15 < in_ESI)) {
    if (in_ESI < 0x16) {
      in_RDI[0x335] = in_ESI;
    }
    else {
      initBiomeNoise(in_stack_00000030,in_stack_0000002c);
    }
  }
  else {
    setupLayerStack(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    in_RDI[0x506] = 0;
    in_RDI[0x507] = 0;
    if (((in_EDX & 4) != 0) && (0xf < in_ESI)) {
      piVar1 = in_RDI + 0x3b0;
      pLVar2 = setupLayer((Layer *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
                          (int)((ulong)piVar1 >> 0x20),(int8_t)((ulong)piVar1 >> 0x18),
                          (int8_t)((ulong)piVar1 >> 0x10),*(uint64_t *)(in_RDI + 0x456),
                          unaff_retaddr->layers,in_stack_00000008);
      *(Layer **)(in_RDI + 0x456) = pLVar2;
      piVar1 = in_RDI + 0x38c;
      pLVar2 = setupLayer((Layer *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
                          (int)((ulong)piVar1 >> 0x20),(int8_t)((ulong)piVar1 >> 0x18),
                          (int8_t)((ulong)piVar1 >> 0x10),*(uint64_t *)(in_RDI + 0x458),
                          unaff_retaddr->layers,in_stack_00000008);
      *(Layer **)(in_RDI + 0x458) = pLVar2;
      piVar1 = in_RDI + 0x368;
      pLVar2 = setupLayer((Layer *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
                          (int)((ulong)piVar1 >> 0x20),(int8_t)((ulong)piVar1 >> 0x18),
                          (int8_t)((ulong)piVar1 >> 0x10),*(uint64_t *)(in_RDI + 0x45a),
                          unaff_retaddr->layers,in_stack_00000008);
      *(Layer **)(in_RDI + 0x45a) = pLVar2;
    }
  }
  return;
}

Assistant:

void setupGenerator(Generator *g, int mc, uint32_t flags)
{
    g->mc = mc;
    g->dim = DIM_UNDEF;
    g->flags = flags;
    g->seed = 0;
    g->sha = 0;

    if (mc >= MC_B1_8 && mc <= MC_1_17)
    {
        setupLayerStack(&g->ls, mc, flags & LARGE_BIOMES);
        g->entry = NULL;
        if (flags & FORCE_OCEAN_VARIANTS && mc >= MC_1_13)
        {
            g->ls.entry_16 = setupLayer(
                g->xlayer+2, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_16, &g->ls.layers[L_ZOOM_16_OCEAN]);

            g->ls.entry_64 = setupLayer(
                g->xlayer+3, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_64, &g->ls.layers[L_ZOOM_64_OCEAN]);

            g->ls.entry_256 = setupLayer(
                g->xlayer+4, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_256, &g->ls.layers[L_OCEAN_TEMP_256]);
        }
    }
    else if (mc >= MC_1_18)
    {
        initBiomeNoise(&g->bn, mc);
    }
    else
    {
        g->bnb.mc = mc;
    }
}